

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGenerator::ExpandRuleVariable
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *variable,
          RuleVariables *replaceValues)

{
  cmMakefile *pcVar1;
  cmTarget *pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  char **ppcVar5;
  long *plVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  string *source;
  size_t sVar10;
  size_type *psVar11;
  pointer pbVar12;
  size_type sVar13;
  pointer pcVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  cmOutputConverter *this_00;
  string actualReplace;
  string arg1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  long *local_d8 [2];
  long local_c8 [2];
  char *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  long local_68;
  char *local_60;
  char *local_58;
  pointer local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((replaceValues->LinkFlags != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->LinkFlags;
    goto LAB_00253e9b;
  }
  if ((replaceValues->Flags != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->Flags;
    goto LAB_00253e9b;
  }
  if ((replaceValues->Source != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->Source;
    goto LAB_00253e9b;
  }
  if ((replaceValues->PreprocessedSource != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->PreprocessedSource;
    goto LAB_00253e9b;
  }
  if ((replaceValues->AssemblySource != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->AssemblySource;
    goto LAB_00253e9b;
  }
  if ((replaceValues->Object != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->Object;
    goto LAB_00253e9b;
  }
  if ((replaceValues->ObjectDir != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->ObjectDir;
    goto LAB_00253e9b;
  }
  if ((replaceValues->ObjectFileDir != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->ObjectFileDir;
    goto LAB_00253e9b;
  }
  if ((replaceValues->Objects != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->Objects;
    goto LAB_00253e9b;
  }
  if ((replaceValues->ObjectsQuoted != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->ObjectsQuoted;
    goto LAB_00253e9b;
  }
  if ((replaceValues->Defines != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->Defines;
    goto LAB_00253e9b;
  }
  if ((replaceValues->TargetPDB != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->TargetPDB;
    goto LAB_00253e9b;
  }
  if ((replaceValues->TargetCompilePDB != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->TargetCompilePDB;
    goto LAB_00253e9b;
  }
  if ((replaceValues->DependencyFile != (char *)0x0) &&
     (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
    pcVar7 = replaceValues->DependencyFile;
    goto LAB_00253e9b;
  }
  if (replaceValues->Target == (char *)0x0) {
LAB_0025349c:
    iVar4 = std::__cxx11::string::compare((char *)variable);
    if ((iVar4 != 0) &&
       ((iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 != 0 &&
        (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 != 0)))) {
      if ((replaceValues->LinkLibraries == (char *)0x0) ||
         (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 != 0)) {
        if ((replaceValues->Language == (char *)0x0) ||
           (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 != 0)) {
          if (replaceValues->CMTarget != (cmTarget *)0x0) {
            iVar4 = std::__cxx11::string::compare((char *)variable);
            if (iVar4 == 0) {
              pcVar2 = replaceValues->CMTarget;
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar14 = (pcVar2->Name)._M_dataplus._M_p;
              sVar13 = (pcVar2->Name)._M_string_length;
LAB_0025413e:
              std::__cxx11::string::_M_construct<char*>
                        ((string *)__return_storage_ptr__,pcVar14,pcVar14 + sVar13);
              return __return_storage_ptr__;
            }
            iVar4 = std::__cxx11::string::compare((char *)variable);
            if (iVar4 == 0) {
              pcVar7 = cmTarget::GetTargetTypeName(replaceValues->CMTarget->TargetTypeValue);
              goto LAB_00253e9b;
            }
          }
          if ((replaceValues->Output == (char *)0x0) ||
             (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 != 0)) {
            iVar4 = std::__cxx11::string::compare((char *)variable);
            if (iVar4 == 0) {
              source = cmSystemTools::GetCMakeCommand_abi_cxx11_();
              cmOutputConverter::Convert
                        (__return_storage_ptr__,&this->super_cmOutputConverter,source,FULL,SHELL);
              return __return_storage_ptr__;
            }
            cmState::GetEnabledLanguages_abi_cxx11_
                      (&local_48,this->GlobalGenerator->CMakeInstance->State);
            ppcVar5 = ruleReplaceVars;
            local_68 = 0;
            pbVar12 = local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            do {
              if (local_48.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != pbVar12) {
                local_58 = *ppcVar5;
                pbVar12 = local_48.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  paVar15 = &local_118.field_2;
                  local_b8 = (pbVar12->_M_dataplus)._M_p;
                  local_50 = pbVar12;
                  std::__cxx11::string::string((string *)&local_f8,local_58,(allocator *)&local_b0);
                  iVar4 = std::__cxx11::string::compare((char *)&local_f8);
                  if (iVar4 == 0) {
                    std::operator+(&local_b0,&local_f8,"_ARG1");
                    cmsys::SystemTools::ReplaceString(&local_b0,"${LANG}",local_b8);
                    local_60 = cmMakefile::GetDefinition(this->Makefile,&local_b0);
                    pcVar1 = this->Makefile;
                    local_d8[0] = local_c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CMAKE_","");
                    plVar6 = (long *)std::__cxx11::string::append((char *)local_d8);
                    psVar11 = (size_type *)(plVar6 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar6 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_118.field_2._M_allocated_capacity = *psVar11;
                      local_118.field_2._8_8_ = plVar6[3];
                      local_118._M_dataplus._M_p = (pointer)paVar15;
                    }
                    else {
                      local_118.field_2._M_allocated_capacity = *psVar11;
                      local_118._M_dataplus._M_p = (pointer)*plVar6;
                    }
                    local_118._M_string_length = plVar6[1];
                    *plVar6 = (long)psVar11;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
                    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                    psVar11 = (size_type *)(plVar6 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar6 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_138.field_2._M_allocated_capacity = *psVar11;
                      local_138.field_2._8_8_ = plVar6[3];
                    }
                    else {
                      local_138.field_2._M_allocated_capacity = *psVar11;
                      local_138._M_dataplus._M_p = (pointer)*plVar6;
                    }
                    local_138._M_string_length = plVar6[1];
                    *plVar6 = (long)psVar11;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    local_70 = cmMakefile::GetDefinition(pcVar1,&local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != paVar15) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                    }
                    if (local_d8[0] != local_c8) {
                      operator_delete(local_d8[0],local_c8[0] + 1);
                    }
                    pcVar1 = this->Makefile;
                    local_d8[0] = local_c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CMAKE_","");
                    plVar6 = (long *)std::__cxx11::string::append((char *)local_d8);
                    psVar11 = (size_type *)(plVar6 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar6 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_118.field_2._M_allocated_capacity = *psVar11;
                      local_118.field_2._8_8_ = plVar6[3];
                      local_118._M_dataplus._M_p = (pointer)paVar15;
                    }
                    else {
                      local_118.field_2._M_allocated_capacity = *psVar11;
                      local_118._M_dataplus._M_p = (pointer)*plVar6;
                    }
                    local_118._M_string_length = plVar6[1];
                    *plVar6 = (long)psVar11;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
                    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                    psVar11 = (size_type *)(plVar6 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar6 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_138.field_2._M_allocated_capacity = *psVar11;
                      local_138.field_2._8_8_ = plVar6[3];
                    }
                    else {
                      local_138.field_2._M_allocated_capacity = *psVar11;
                      local_138._M_dataplus._M_p = (pointer)*plVar6;
                    }
                    local_138._M_string_length = plVar6[1];
                    *plVar6 = (long)psVar11;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    local_78 = cmMakefile::GetDefinition(pcVar1,&local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != paVar15) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                    }
                    if (local_d8[0] != local_c8) {
                      operator_delete(local_d8[0],local_c8[0] + 1);
                    }
                    pcVar1 = this->Makefile;
                    local_d8[0] = local_c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CMAKE_","");
                    plVar6 = (long *)std::__cxx11::string::append((char *)local_d8);
                    psVar11 = (size_type *)(plVar6 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar6 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_118.field_2._M_allocated_capacity = *psVar11;
                      local_118.field_2._8_8_ = plVar6[3];
                      local_118._M_dataplus._M_p = (pointer)paVar15;
                    }
                    else {
                      local_118.field_2._M_allocated_capacity = *psVar11;
                      local_118._M_dataplus._M_p = (pointer)*plVar6;
                    }
                    local_118._M_string_length = plVar6[1];
                    *plVar6 = (long)psVar11;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
                    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                    psVar11 = (size_type *)(plVar6 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar6 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_138.field_2._M_allocated_capacity = *psVar11;
                      local_138.field_2._8_8_ = plVar6[3];
                    }
                    else {
                      local_138.field_2._M_allocated_capacity = *psVar11;
                      local_138._M_dataplus._M_p = (pointer)*plVar6;
                    }
                    local_138._M_string_length = plVar6[1];
                    *plVar6 = (long)psVar11;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    local_80 = cmMakefile::GetDefinition(pcVar1,&local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != paVar15) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                    }
                    if (local_d8[0] != local_c8) {
                      operator_delete(local_d8[0],local_c8[0] + 1);
                    }
                    pcVar1 = this->Makefile;
                    local_d8[0] = local_c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CMAKE_","");
                    plVar6 = (long *)std::__cxx11::string::append((char *)local_d8);
                    psVar11 = (size_type *)(plVar6 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar6 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_118.field_2._M_allocated_capacity = *psVar11;
                      local_118.field_2._8_8_ = plVar6[3];
                      local_118._M_dataplus._M_p = (pointer)paVar15;
                    }
                    else {
                      local_118.field_2._M_allocated_capacity = *psVar11;
                      local_118._M_dataplus._M_p = (pointer)*plVar6;
                    }
                    local_118._M_string_length = plVar6[1];
                    *plVar6 = (long)psVar11;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
                    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                    psVar11 = (size_type *)(plVar6 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar6 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_138.field_2._M_allocated_capacity = *psVar11;
                      local_138.field_2._8_8_ = plVar6[3];
                    }
                    else {
                      local_138.field_2._M_allocated_capacity = *psVar11;
                      local_138._M_dataplus._M_p = (pointer)*plVar6;
                    }
                    local_138._M_string_length = plVar6[1];
                    *plVar6 = (long)psVar11;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    local_88 = cmMakefile::GetDefinition(pcVar1,&local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != paVar15) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                    }
                    if (local_d8[0] != local_c8) {
                      operator_delete(local_d8[0],local_c8[0] + 1);
                    }
                    pcVar1 = this->Makefile;
                    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_138,"CMAKE_SYSROOT","");
                    local_90 = cmMakefile::GetDefinition(pcVar1,&local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                    pcVar1 = this->Makefile;
                    local_d8[0] = local_c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CMAKE_","");
                    plVar6 = (long *)std::__cxx11::string::append((char *)local_d8);
                    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                    psVar11 = (size_type *)(plVar6 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar6 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_118.field_2._M_allocated_capacity = *psVar11;
                      local_118.field_2._8_8_ = plVar6[3];
                    }
                    else {
                      local_118.field_2._M_allocated_capacity = *psVar11;
                      local_118._M_dataplus._M_p = (pointer)*plVar6;
                    }
                    local_118._M_string_length = plVar6[1];
                    *plVar6 = (long)psVar11;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
                    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                    psVar11 = (size_type *)(plVar6 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar6 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_138.field_2._M_allocated_capacity = *psVar11;
                      local_138.field_2._8_8_ = plVar6[3];
                    }
                    else {
                      local_138.field_2._M_allocated_capacity = *psVar11;
                      local_138._M_dataplus._M_p = (pointer)*plVar6;
                    }
                    local_138._M_string_length = plVar6[1];
                    *plVar6 = (long)psVar11;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    pcVar7 = cmMakefile::GetDefinition(pcVar1,&local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != &local_118.field_2) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                    }
                    if (local_d8[0] != local_c8) {
                      operator_delete(local_d8[0],local_c8[0] + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p,
                                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                               local_b0.field_2._M_local_buf[0]) + 1);
                    }
                  }
                  else {
                    local_60 = (char *)0x0;
                    local_70 = (char *)0x0;
                    local_78 = (char *)0x0;
                    local_80 = (char *)0x0;
                    local_88 = (char *)0x0;
                    local_90 = (char *)0x0;
                    pcVar7 = (char *)0x0;
                  }
                  lVar8 = std::__cxx11::string::find((char *)&local_f8,0x4aa737,0);
                  if (lVar8 != -1) {
                    cmsys::SystemTools::ReplaceString(&local_f8,"${LANG}",local_b8);
                  }
                  _Var3._M_p = local_f8._M_dataplus._M_p;
                  if ((local_f8._M_string_length == variable->_M_string_length) &&
                     ((local_f8._M_string_length == 0 ||
                      (iVar4 = bcmp(local_f8._M_dataplus._M_p,(variable->_M_dataplus)._M_p,
                                    local_f8._M_string_length), iVar4 == 0)))) {
                    pcVar9 = cmMakefile::GetSafeDefinition(this->Makefile,variable);
                    std::__cxx11::string::string((string *)&local_b0,pcVar9,(allocator *)&local_138)
                    ;
                    lVar8 = std::__cxx11::string::find((char *)variable,0x4b29d4,0);
                    if (lVar8 == -1) {
                      this_00 = &this->super_cmOutputConverter;
                      cmOutputConverter::ConvertToOutputForExisting
                                (__return_storage_ptr__,this_00,&local_b0,START_OUTPUT,SHELL);
                      if (local_60 != (char *)0x0) {
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                      }
                      if (local_78 != (char *)0x0 && local_70 != (char *)0x0) {
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                      }
                      if (local_88 != (char *)0x0 && local_80 != (char *)0x0) {
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        pcVar9 = local_80;
                        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                        sVar10 = strlen(local_80);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_118,pcVar9,pcVar9 + sVar10);
                        cmOutputConverter::EscapeForShell
                                  (&local_138,this_00,&local_118,true,false,false);
                        std::__cxx11::string::_M_append
                                  ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p)
                        ;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138._M_dataplus._M_p != &local_138.field_2) {
                          operator_delete(local_138._M_dataplus._M_p,
                                          local_138.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_118._M_dataplus._M_p != &local_118.field_2) {
                          operator_delete(local_118._M_dataplus._M_p,
                                          local_118.field_2._M_allocated_capacity + 1);
                        }
                      }
                      if (pcVar7 != (char *)0x0 && local_90 != (char *)0x0) {
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        pcVar7 = local_90;
                        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                        sVar10 = strlen(local_90);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_118,pcVar7,pcVar7 + sVar10);
                        cmOutputConverter::EscapeForShell
                                  (&local_138,this_00,&local_118,true,false,false);
                        std::__cxx11::string::_M_append
                                  ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p)
                        ;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138._M_dataplus._M_p != &local_138.field_2) {
                          operator_delete(local_138._M_dataplus._M_p,
                                          local_138.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_118._M_dataplus._M_p != &local_118.field_2) {
                          operator_delete(local_118._M_dataplus._M_p,
                                          local_118.field_2._M_allocated_capacity + 1);
                        }
                      }
                    }
                    else {
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
                        (__return_storage_ptr__->field_2)._M_allocated_capacity =
                             CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                      local_b0.field_2._M_local_buf[0]);
                        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                             local_b0.field_2._8_8_;
                      }
                      else {
                        (__return_storage_ptr__->_M_dataplus)._M_p = local_b0._M_dataplus._M_p;
                        (__return_storage_ptr__->field_2)._M_allocated_capacity =
                             CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                      local_b0.field_2._M_local_buf[0]);
                      }
                      __return_storage_ptr__->_M_string_length = local_b0._M_string_length;
                      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                      local_b0._M_string_length = 0;
                      local_b0.field_2._M_local_buf[0] = '\0';
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p,
                                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                               local_b0.field_2._M_local_buf[0]) + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                      operator_delete(local_f8._M_dataplus._M_p,
                                      local_f8.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_002544b8;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var3._M_p != &local_f8.field_2) {
                    operator_delete(_Var3._M_p,local_f8.field_2._M_allocated_capacity + 1);
                  }
                  pbVar12 = local_50 + 1;
                } while (pbVar12 !=
                         local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              ppcVar5 = ruleReplaceVars + local_68 + 1;
              local_68 = local_68 + 1;
              if (local_68 == 0xe) {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                pcVar14 = (variable->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)__return_storage_ptr__,pcVar14,
                           pcVar14 + variable->_M_string_length);
LAB_002544b8:
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_48);
                return __return_storage_ptr__;
              }
            } while( true );
          }
          pcVar7 = replaceValues->Output;
        }
        else {
          pcVar7 = replaceValues->Language;
        }
      }
      else {
        pcVar7 = replaceValues->LinkLibraries;
      }
LAB_00253e9b:
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar7,(allocator *)&local_f8);
      return __return_storage_ptr__;
    }
    if (replaceValues->TargetSOName != (char *)0x0) {
      iVar4 = std::__cxx11::string::compare((char *)variable);
      if (iVar4 == 0) {
        pcVar7 = replaceValues->TargetSOName;
        goto LAB_00253e9b;
      }
      iVar4 = std::__cxx11::string::compare((char *)variable);
      if ((iVar4 == 0) && (pcVar7 = replaceValues->SONameFlag, pcVar7 != (char *)0x0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        goto LAB_00254079;
      }
      if ((replaceValues->TargetInstallNameDir != (char *)0x0) &&
         (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
        pcVar7 = replaceValues->TargetInstallNameDir;
        goto LAB_00253e9b;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "";
    pcVar7 = "";
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)variable);
    if (iVar4 == 0) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,replaceValues->Target,(allocator *)&local_f8);
      if (__return_storage_ptr__->_M_string_length == 0) {
        return __return_storage_ptr__;
      }
      if (*(__return_storage_ptr__->_M_dataplus)._M_p == '\"') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,'\x01');
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    iVar4 = std::__cxx11::string::compare((char *)variable);
    if (iVar4 == 0) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,replaceValues->Target,(allocator *)&local_f8);
      if (__return_storage_ptr__->_M_string_length < 3) {
        return __return_storage_ptr__;
      }
      pcVar7 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if (*pcVar7 != '\"') {
        return __return_storage_ptr__;
      }
      if (pcVar7[__return_storage_ptr__->_M_string_length - 1] != '\"') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)&local_f8,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f8);
LAB_002541f7:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    if ((replaceValues->LanguageCompileFlags != (char *)0x0) &&
       (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
      pcVar7 = replaceValues->LanguageCompileFlags;
      goto LAB_00253e9b;
    }
    if ((replaceValues->Target != (char *)0x0) &&
       (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
      pcVar7 = replaceValues->Target;
      goto LAB_00253e9b;
    }
    iVar4 = std::__cxx11::string::compare((char *)variable);
    if (iVar4 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar14 = (this->TargetImplib)._M_dataplus._M_p;
      sVar13 = (this->TargetImplib)._M_string_length;
      goto LAB_0025413e;
    }
    iVar4 = std::__cxx11::string::compare((char *)variable);
    if (iVar4 == 0) {
      pcVar7 = replaceValues->TargetVersionMajor;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)variable);
      if (iVar4 != 0) {
        if ((replaceValues->Target != (char *)0x0) &&
           (iVar4 = std::__cxx11::string::compare((char *)variable), iVar4 == 0)) {
          std::__cxx11::string::string
                    ((string *)&local_f8,replaceValues->Target,(allocator *)&local_b0);
          lVar8 = std::__cxx11::string::rfind((char *)&local_f8,0x4b67a7,0xffffffffffffffff);
          if (lVar8 == -1) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   local_f8.field_2._M_allocated_capacity;
              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f8.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = local_f8._M_dataplus._M_p;
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   local_f8.field_2._M_allocated_capacity;
            }
            __return_storage_ptr__->_M_string_length = local_f8._M_string_length;
            return __return_storage_ptr__;
          }
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_f8);
          goto LAB_002541f7;
        }
        goto LAB_0025349c;
      }
      pcVar7 = replaceValues->TargetVersionMinor;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "0";
      pcVar9 = "";
      goto LAB_0025409e;
    }
LAB_00254079:
    sVar10 = strlen(pcVar7);
    pcVar9 = pcVar7 + sVar10;
  }
LAB_0025409e:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar9);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmLocalGenerator::ExpandRuleVariable(std::string const& variable,
                                     const RuleVariables& replaceValues)
{
  if(replaceValues.LinkFlags)
    {
    if(variable == "LINK_FLAGS")
      {
      return replaceValues.LinkFlags;
      }
    }
  if(replaceValues.Flags)
    {
    if(variable == "FLAGS")
      {
      return replaceValues.Flags;
      }
    }

  if(replaceValues.Source)
    {
    if(variable == "SOURCE")
      {
      return replaceValues.Source;
      }
    }
  if(replaceValues.PreprocessedSource)
    {
    if(variable == "PREPROCESSED_SOURCE")
      {
      return replaceValues.PreprocessedSource;
      }
    }
  if(replaceValues.AssemblySource)
    {
    if(variable == "ASSEMBLY_SOURCE")
      {
      return replaceValues.AssemblySource;
      }
    }
  if(replaceValues.Object)
    {
    if(variable == "OBJECT")
      {
      return replaceValues.Object;
      }
    }
  if(replaceValues.ObjectDir)
    {
    if(variable == "OBJECT_DIR")
      {
      return replaceValues.ObjectDir;
      }
    }
  if(replaceValues.ObjectFileDir)
    {
    if(variable == "OBJECT_FILE_DIR")
      {
      return replaceValues.ObjectFileDir;
      }
    }
  if(replaceValues.Objects)
    {
    if(variable == "OBJECTS")
      {
      return replaceValues.Objects;
      }
    }
  if(replaceValues.ObjectsQuoted)
    {
    if(variable == "OBJECTS_QUOTED")
      {
      return replaceValues.ObjectsQuoted;
      }
    }
  if(replaceValues.Defines && variable == "DEFINES")
    {
    return replaceValues.Defines;
    }
  if(replaceValues.TargetPDB )
    {
    if(variable == "TARGET_PDB")
      {
      return replaceValues.TargetPDB;
      }
    }
  if(replaceValues.TargetCompilePDB)
    {
    if(variable == "TARGET_COMPILE_PDB")
      {
      return replaceValues.TargetCompilePDB;
      }
    }
  if(replaceValues.DependencyFile )
    {
    if(variable == "DEP_FILE")
      {
      return replaceValues.DependencyFile;
      }
    }

  if(replaceValues.Target)
    {
    if(variable == "TARGET_QUOTED")
      {
      std::string targetQuoted = replaceValues.Target;
      if(!targetQuoted.empty() && targetQuoted[0] != '\"')
        {
        targetQuoted = '\"';
        targetQuoted += replaceValues.Target;
        targetQuoted += '\"';
        }
      return targetQuoted;
      }
    if(variable == "TARGET_UNQUOTED")
      {
      std::string unquoted = replaceValues.Target;
      std::string::size_type sz = unquoted.size();
      if(sz > 2 && unquoted[0] == '\"' && unquoted[sz-1] == '\"')
        {
        unquoted = unquoted.substr(1, sz-2);
        }
      return unquoted;
      }
    if(replaceValues.LanguageCompileFlags)
      {
      if(variable == "LANGUAGE_COMPILE_FLAGS")
        {
        return replaceValues.LanguageCompileFlags;
        }
      }
    if(replaceValues.Target)
      {
      if(variable == "TARGET")
        {
        return replaceValues.Target;
        }
      }
    if(variable == "TARGET_IMPLIB")
      {
      return this->TargetImplib;
      }
    if(variable == "TARGET_VERSION_MAJOR")
      {
      if(replaceValues.TargetVersionMajor)
        {
        return replaceValues.TargetVersionMajor;
        }
      else
        {
        return "0";
        }
      }
    if(variable == "TARGET_VERSION_MINOR")
      {
      if(replaceValues.TargetVersionMinor)
        {
        return replaceValues.TargetVersionMinor;
        }
      else
        {
        return "0";
        }
      }
    if(replaceValues.Target)
      {
      if(variable == "TARGET_BASE")
        {
        // Strip the last extension off the target name.
        std::string targetBase = replaceValues.Target;
        std::string::size_type pos = targetBase.rfind(".");
        if(pos != targetBase.npos)
          {
        return targetBase.substr(0, pos);
          }
        else
          {
          return targetBase;
          }
        }
      }
    }
  if(variable == "TARGET_SONAME" || variable == "SONAME_FLAG" ||
     variable == "TARGET_INSTALLNAME_DIR")
    {
    // All these variables depend on TargetSOName
    if(replaceValues.TargetSOName)
      {
      if(variable == "TARGET_SONAME")
        {
        return replaceValues.TargetSOName;
        }
      if(variable == "SONAME_FLAG" && replaceValues.SONameFlag)
        {
        return replaceValues.SONameFlag;
        }
      if(replaceValues.TargetInstallNameDir &&
         variable == "TARGET_INSTALLNAME_DIR")
        {
        return replaceValues.TargetInstallNameDir;
        }
      }
    return "";
    }
  if(replaceValues.LinkLibraries)
    {
    if(variable == "LINK_LIBRARIES")
      {
      return replaceValues.LinkLibraries;
      }
    }
  if(replaceValues.Language)
    {
    if(variable == "LANGUAGE")
      {
      return replaceValues.Language;
      }
    }
  if(replaceValues.CMTarget)
    {
    if(variable == "TARGET_NAME")
      {
      return replaceValues.CMTarget->GetName();
      }
    if(variable == "TARGET_TYPE")
      {
      return cmTarget::GetTargetTypeName(replaceValues.CMTarget->GetType());
      }
    }
  if(replaceValues.Output)
    {
    if(variable == "OUTPUT")
      {
      return replaceValues.Output;
      }
    }
  if(variable == "CMAKE_COMMAND")
    {
    return this->Convert(cmSystemTools::GetCMakeCommand(), FULL, SHELL);
    }
  std::vector<std::string> enabledLanguages =
      this->GetState()->GetEnabledLanguages();
  // loop over language specific replace variables
  int pos = 0;
  while(ruleReplaceVars[pos])
    {
    for(std::vector<std::string>::iterator i = enabledLanguages.begin();
        i != enabledLanguages.end(); ++i)
      {
      const char* lang = i->c_str();
      std::string actualReplace = ruleReplaceVars[pos];
      // If this is the compiler then look for the extra variable
      // _COMPILER_ARG1 which must be the first argument to the compiler
      const char* compilerArg1 = 0;
      const char* compilerTarget = 0;
      const char* compilerOptionTarget = 0;
      const char* compilerExternalToolchain = 0;
      const char* compilerOptionExternalToolchain = 0;
      const char* compilerSysroot = 0;
      const char* compilerOptionSysroot = 0;
      if(actualReplace == "CMAKE_${LANG}_COMPILER")
        {
        std::string arg1 = actualReplace + "_ARG1";
        cmSystemTools::ReplaceString(arg1, "${LANG}", lang);
        compilerArg1 = this->Makefile->GetDefinition(arg1);
        compilerTarget
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang + "_COMPILER_TARGET");
        compilerOptionTarget
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                                          "_COMPILE_OPTIONS_TARGET");
        compilerExternalToolchain
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                                    "_COMPILER_EXTERNAL_TOOLCHAIN");
        compilerOptionExternalToolchain
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                              "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN");
        compilerSysroot
              = this->Makefile->GetDefinition("CMAKE_SYSROOT");
        compilerOptionSysroot
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                              "_COMPILE_OPTIONS_SYSROOT");
        }
      if(actualReplace.find("${LANG}") != actualReplace.npos)
        {
        cmSystemTools::ReplaceString(actualReplace, "${LANG}", lang);
        }
      if(actualReplace == variable)
        {
        std::string replace =
          this->Makefile->GetSafeDefinition(variable);
        // if the variable is not a FLAG then treat it like a path
        if(variable.find("_FLAG") == variable.npos)
          {
          std::string ret = this->ConvertToOutputForExisting(replace);
          // if there is a required first argument to the compiler add it
          // to the compiler string
          if(compilerArg1)
            {
            ret += " ";
            ret += compilerArg1;
            }
          if (compilerTarget && compilerOptionTarget)
            {
            ret += " ";
            ret += compilerOptionTarget;
            ret += compilerTarget;
            }
          if (compilerExternalToolchain && compilerOptionExternalToolchain)
            {
            ret += " ";
            ret += compilerOptionExternalToolchain;
            ret += this->EscapeForShell(compilerExternalToolchain, true);
            }
          if (compilerSysroot && compilerOptionSysroot)
            {
            ret += " ";
            ret += compilerOptionSysroot;
            ret += this->EscapeForShell(compilerSysroot, true);
            }
          return ret;
          }
        return replace;
        }
      }
    pos++;
    }
  return variable;
}